

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageViewPrivate::normalizePagePos(PageViewPrivate *this)

{
  QVariantAnimation *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QVariant local_40;
  
  this->indexAfterNormalizeAnimation = -1;
  iVar2 = this->pagesOffset;
  iVar3 = -iVar2;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  iVar5 = *(int *)(*(long *)(this->viewport + 0x20) + 0x1c) -
          *(int *)(*(long *)(this->viewport + 0x20) + 0x14);
  iVar4 = 0;
  if ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1 < iVar3) {
    if (iVar2 < 0) {
      iVar2 = PageControl::currentIndex(this->control);
      iVar3 = PageControl::count(this->control);
      if (iVar2 < iVar3 + -1) {
        iVar2 = PageControl::currentIndex(this->control);
        this->indexAfterNormalizeAnimation = iVar2 + 1;
        iVar4 = ~*(uint *)(*(long *)(this->viewport + 0x20) + 0x1c) +
                *(int *)(*(long *)(this->viewport + 0x20) + 0x14);
        goto LAB_0016b541;
      }
      iVar2 = this->pagesOffset;
    }
    iVar4 = 0;
    if (0 < iVar2) {
      iVar2 = PageControl::currentIndex(this->control);
      if (iVar2 != 0) {
        iVar2 = PageControl::currentIndex(this->control);
        this->indexAfterNormalizeAnimation = iVar2 + -1;
        iVar4 = (*(int *)(*(long *)(this->viewport + 0x20) + 0x1c) -
                *(int *)(*(long *)(this->viewport + 0x20) + 0x14)) + 1;
      }
    }
  }
LAB_0016b541:
  pQVar1 = this->normalizeAnimation;
  QVariant::QVariant(&local_40,this->pagesOffset);
  QVariantAnimation::setStartValue((QVariant *)pQVar1);
  QVariant::~QVariant(&local_40);
  pQVar1 = this->normalizeAnimation;
  QVariant::QVariant(&local_40,iVar4);
  QVariantAnimation::setEndValue((QVariant *)pQVar1);
  QVariant::~QVariant(&local_40);
  QAbstractAnimation::start(this->normalizeAnimation,0);
  return;
}

Assistant:

void
PageViewPrivate::normalizePagePos()
{
	indexAfterNormalizeAnimation = -1;

	int endPos = 0;

	if( qAbs( pagesOffset ) > viewport->width() / 2 )
	{
		if( pagesOffset < 0 && control->currentIndex() < control->count() - 1 )
		{
			indexAfterNormalizeAnimation = control->currentIndex() + 1;

			endPos = - viewport->width();
		}
		else if( pagesOffset > 0 && control->currentIndex() != 0 )
		{
			indexAfterNormalizeAnimation = control->currentIndex() - 1;

			endPos = viewport->width();
		}
	}

	normalizeAnimation->setStartValue( pagesOffset );
	normalizeAnimation->setEndValue( endPos );

	normalizeAnimation->start();
}